

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false>::
SimpleDictionaryTypeHandlerBase
          (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *this,
          Recycler *recycler,
          SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_false> *typeHandler)

{
  byte bVar1;
  byte bVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar6;
  byte bVar7;
  byte bVar8;
  Type *addr;
  
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler =
       (_func_int **)&PTR___cxa_pure_virtual_01557c08;
  bVar1 = (typeHandler->super_DynamicTypeHandler).propertyTypes;
  (this->super_DynamicTypeHandler).propertyTypes = bVar1;
  (this->super_DynamicTypeHandler).flags = (typeHandler->super_DynamicTypeHandler).flags;
  (this->super_DynamicTypeHandler).offsetOfInlineSlots =
       (typeHandler->super_DynamicTypeHandler).offsetOfInlineSlots;
  (this->super_DynamicTypeHandler).slotCapacity =
       (typeHandler->super_DynamicTypeHandler).slotCapacity;
  (this->super_DynamicTypeHandler).unusedBytes = (typeHandler->super_DynamicTypeHandler).unusedBytes
  ;
  (this->super_DynamicTypeHandler).inlineSlotCapacity =
       (typeHandler->super_DynamicTypeHandler).inlineSlotCapacity;
  (this->super_DynamicTypeHandler).protoCachesWereInvalidated = false;
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01553a50
  ;
  (this->propertyMap).ptr =
       (BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  bVar7 = typeHandler->field_0x28 & 1;
  bVar2 = this->field_0x28;
  this->field_0x28 = bVar2 & 0xfe | bVar7;
  bVar8 = typeHandler->field_0x28 & 2;
  this->field_0x28 = bVar2 & 0xfc | bVar7 | bVar8;
  this->field_0x28 = bVar2 & 0xf8 | bVar7 | bVar8 | typeHandler->field_0x28 & 4;
  this->numDeletedProperties = typeHandler->numDeletedProperties;
  this->nextPropertyIndex = typeHandler->nextPropertyIndex;
  if ((bVar1 & 0x40) >> 6 != ((typeHandler->super_DynamicTypeHandler).propertyTypes & 0x40) >> 6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x155,
                                "(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked())"
                                ,
                                "this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked()"
                               );
    if (!bVar4) goto LAB_00e0b871;
    *puVar5 = 0;
  }
  if (0x3fffffff < (this->super_DynamicTypeHandler).slotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x156,"(this->GetSlotCapacity() <= MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() <= MaxPropertyIndexSize");
    if (!bVar4) {
LAB_00e0b871:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  addr = &this->propertyMap;
  pBVar6 = JsUtil::
           BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
           ::Clone((typeHandler->propertyMap).ptr);
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pBVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SimpleDictionaryTypeHandlerBase(Recycler* recycler, SimpleDictionaryTypeHandlerBase * typeHandler) :
        DynamicTypeHandler(typeHandler),
        nextPropertyIndex(typeHandler->nextPropertyIndex),
        singletonInstance(nullptr),
        _gc_tag(typeHandler->_gc_tag),
        isUnordered(typeHandler->isUnordered),
        hasNamelessPropertyId(typeHandler->hasNamelessPropertyId),
        numDeletedProperties(typeHandler->numDeletedProperties)
    {
        Assert(this->GetIsInlineSlotCapacityLocked() == typeHandler->GetIsInlineSlotCapacityLocked());
        Assert(this->GetSlotCapacity() <= MaxPropertyIndexSize);
        propertyMap = typeHandler->propertyMap->Clone();
    }